

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O1

lzma_ret lzma_lzma_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  undefined4 *ptr;
  int iVar1;
  char cVar2;
  byte bVar3;
  lzma_ret lVar4;
  byte bVar5;
  
  lVar4 = LZMA_OPTIONS_ERROR;
  if (props_size == 5) {
    ptr = (undefined4 *)lzma_alloc(0x70,allocator);
    if (ptr == (undefined4 *)0x0) {
      lVar4 = LZMA_MEM_ERROR;
    }
    else {
      bVar3 = *props;
      if (bVar3 < 0xe1) {
        cVar2 = (char)((uint)bVar3 * 0x6d >> 8);
        bVar5 = (byte)(((byte)(bVar3 - cVar2) >> 1) + cVar2) >> 5;
        ptr[7] = (uint)bVar5;
        bVar3 = bVar5 * -0x2d + bVar3;
        ptr[6] = bVar3 / 9;
        iVar1 = (uint)bVar3 + (bVar3 / 9) * -9;
        ptr[5] = iVar1;
        if (iVar1 + bVar3 / 9 < 5) {
          *ptr = *(undefined4 *)(props + 1);
          *(undefined8 *)(ptr + 2) = 0;
          ptr[4] = 0;
          *options = ptr;
          return LZMA_OK;
        }
      }
      lzma_free(ptr,allocator);
    }
  }
  return lVar4;
}

Assistant:

extern lzma_ret
lzma_lzma_props_decode(void **options, const lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	if (props_size != 5)
		return LZMA_OPTIONS_ERROR;

	lzma_options_lzma *opt
			= lzma_alloc(sizeof(lzma_options_lzma), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	if (lzma_lzma_lclppb_decode(opt, props[0]))
		goto error;

	// All dictionary sizes are accepted, including zero. LZ decoder
	// will automatically use a dictionary at least a few KiB even if
	// a smaller dictionary is requested.
	opt->dict_size = unaligned_read32le(props + 1);

	opt->preset_dict = NULL;
	opt->preset_dict_size = 0;

	*options = opt;

	return LZMA_OK;

error:
	lzma_free(opt, allocator);
	return LZMA_OPTIONS_ERROR;
}